

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Configlist_eat(config *cfp)

{
  config *pcVar1;
  config *pcVar2;
  
  if (cfp != (config *)0x0) {
    do {
      pcVar2 = cfp;
      pcVar1 = freelist;
      if (pcVar2->fplp != (plink *)0x0) {
        __assert_fail("cfp->fplp==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x53c,"void Configlist_eat(struct config *)");
      }
      if (pcVar2->bplp != (plink *)0x0) {
        __assert_fail("cfp->bplp==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x53d,"void Configlist_eat(struct config *)");
      }
      cfp = pcVar2->next;
      if (pcVar2->fws != (char *)0x0) {
        free(pcVar2->fws);
      }
      pcVar2->next = pcVar1;
      freelist = pcVar2;
    } while (cfp != (config *)0x0);
  }
  return;
}

Assistant:

void Configlist_eat(struct config *cfp)
{
  struct config *nextcfp;
  for(; cfp; cfp=nextcfp){
    nextcfp = cfp->next;
    assert( cfp->fplp==0 );
    assert( cfp->bplp==0 );
    if( cfp->fws ) SetFree(cfp->fws);
    deleteconfig(cfp);
  }
  return;
}